

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O0

bool __thiscall glu::Layout::operator==(Layout *this,Layout *other)

{
  bool local_19;
  Layout *other_local;
  Layout *this_local;
  
  local_19 = false;
  if ((((this->location == other->location) && (local_19 = false, this->binding == other->binding))
      && (local_19 = false, this->offset == other->offset)) &&
     (local_19 = false, this->format == other->format)) {
    local_19 = this->matrixOrder == other->matrixOrder;
  }
  return local_19;
}

Assistant:

bool Layout::operator== (const Layout& other) const
{
	return	location == other.location &&
			binding == other.binding &&
			offset == other.offset &&
			format == other.format &&
			matrixOrder == other.matrixOrder;
}